

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::DeviceContextGLImpl> __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this,size_t Ctx)

{
  size_type sVar1;
  ulong in_RDX;
  size_t Ctx_local;
  RenderDeviceBase<Diligent::EngineGLImplTraits> *this_local;
  
  sVar1 = std::
          vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
          ::size((vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
                  *)(Ctx + 0x4a8));
  if (in_RDX < sVar1) {
    std::
    vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
    ::operator[]((vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
                  *)(Ctx + 0x4a8),in_RDX);
    RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock
              ((RefCntWeakPtr<Diligent::DeviceContextGLImpl> *)this);
  }
  else {
    RefCntAutoPtr<Diligent::DeviceContextGLImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)this);
  }
  return (RefCntAutoPtr<Diligent::DeviceContextGLImpl>)(DeviceContextGLImpl *)this;
}

Assistant:

RefCntAutoPtr<DeviceContextImplType> GetImmediateContext(size_t Ctx)
    {
        return Ctx < m_wpImmediateContexts.size() ?
            m_wpImmediateContexts[Ctx].Lock() :
            RefCntAutoPtr<DeviceContextImplType>{};
    }